

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_register_type_op
               (sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp parent,sexp slots,sexp fb,sexp felb,
               sexp flb,sexp flo,sexp fls,sexp sb,sexp so,sexp sc,sexp w,sexp wb,sexp wo,sexp ws,
               sexp we,sexp p,char *fname,sexp_proc2 f)

{
  sexp psVar1;
  sexp psVar2;
  ulong uVar3;
  int *piVar4;
  sexp psVar5;
  char *pcVar6;
  char *pcVar7;
  sexp_uint_t sVar8;
  sexp type;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_68;
  local_58.var = &local_60;
  local_60 = (sexp)&DAT_0000043e;
  local_48.next = &local_58;
  local_68 = (sexp)0x43e;
  psVar2 = (ctx->value).type.setters;
  psVar1 = (psVar2->value).type.id;
  pcVar6 = (char *)((long)psVar1 >> 1);
  pcVar7 = ((psVar2->value).port.stream)->_IO_read_ptr;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  if (pcVar6 < (char *)0xffffffff) {
    if ((((ulong)name & 3) == 0) && (name->tag == 9)) {
      local_48.var = &local_68;
      if (pcVar7 <= pcVar6) {
        uVar3 = (long)pcVar7 * 2;
        if (0xfffffffe < uVar3) {
          uVar3 = 0xffffffff;
        }
        local_48.var = &local_68;
        local_60 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)local_48.next,
                                       (sexp)(uVar3 * 2 + 1),(sexp)&DAT_0000043e);
        if ((((ulong)local_60 & 3) == 0) && (psVar2 = local_60, local_60->tag == 0x13))
        goto LAB_0010e5ef;
        if ((sexp)0x1 < psVar1) {
          psVar2 = (((ctx->value).type.setters)->value).type.getters;
          pcVar7 = (char *)0x0;
          do {
            *(undefined8 *)((long)&local_60->value + (long)pcVar7 * 8 + 8) =
                 *(undefined8 *)((long)&psVar2->value + (long)pcVar7 * 8 + 8);
            pcVar7 = pcVar7 + 1;
          } while (pcVar6 + (pcVar6 == (char *)0x0) != pcVar7);
        }
        (((ctx->value).type.setters)->value).type.getters = local_60;
      }
      piVar4 = (int *)sexp_alloc(ctx,0x78);
      if ((piVar4 != (int *)0x0) && ((((ulong)piVar4 & 3) != 0 || (*piVar4 != 0x13)))) {
        *piVar4 = 1;
      }
      *(int **)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
               (long)pcVar6 * 8 + 8) = piVar4;
      local_68 = *(sexp *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                          (long)pcVar6 * 8 + 8);
      if ((((ulong)local_68 & 3) != 0) || (psVar2 = local_68, local_68->tag != 0x13)) {
        local_68->tag = 1;
        (local_68->value).type.tag = (sexp_tag_t)pcVar6;
        (local_68->value).type.slots = slots;
        (local_68->value).type.field_base = (short)((ulong)fb >> 1);
        (local_68->value).type.field_eq_len_base = (short)((ulong)felb >> 1);
        (local_68->value).type.field_len_base = (short)((ulong)flb >> 1);
        (local_68->value).type.field_len_off = (short)((ulong)flo >> 1);
        (local_68->value).type.field_len_scale = (unsigned_short)((ulong)fls >> 1);
        (local_68->value).type.size_base = (short)((ulong)sb >> 1);
        (local_68->value).type.size_off = (short)((ulong)so >> 1);
        (local_68->value).type.size_scale = (unsigned_short)((ulong)sc >> 1);
        (local_68->value).type.weak_base = (short)((ulong)w >> 1);
        (local_68->value).type.weak_len_base = (short)((ulong)wb >> 1);
        (local_68->value).type.weak_len_off = (short)((ulong)wo >> 1);
        (local_68->value).type.weak_len_scale = (short)((ulong)ws >> 1);
        (local_68->value).type.weak_len_extra = (short)((ulong)we >> 1);
        (local_68->value).type.name = name;
        (local_68->value).bytecode.length = 0x3e;
        (local_68->value).bytecode.max_depth = 0x3e;
        (local_68->value).type.finalize = f;
        if (fname == (char *)0x0) {
          psVar2 = (sexp)0x0;
        }
        else {
          psVar2 = sexp_c_string(ctx,fname,-1);
        }
        (local_68->value).type.finalize_name = psVar2;
        (local_68->value).type.id = (sexp)0x3e;
        if (f != (sexp_proc2)0x0) {
          (local_68->value).type.dl = (sexp)(ctx->value).opcode.func;
        }
        (local_68->value).type.print = p;
        if ((((ulong)parent & 3) == 0 && parent != (sexp)0x0) && (parent->tag == 1)) {
          psVar2 = (parent->value).type.cpl;
          sVar8 = 1;
          if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 10)) {
            sVar8 = (psVar2->value).stack.length;
          }
          psVar5 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)local_68,(sexp)(sVar8 * 2 + 3),
                                       (sexp)&DAT_0000043e);
          (local_68->value).type.cpl = psVar5;
          psVar2 = (parent->value).type.cpl;
          if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 10)) {
            memcpy((void *)((long)&psVar5->value + 8),(void *)((long)&psVar2->value + 8),sVar8 * 8);
          }
          else {
            *(sexp *)((long)&psVar5->value + sVar8 * 8) = parent;
          }
        }
        else {
          sVar8 = 0;
          psVar2 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)local_68,(sexp)&DAT_00000003,
                                       (sexp)&DAT_0000043e);
          (local_68->value).type.cpl = psVar2;
        }
        *(sexp *)((long)&((local_68->value).type.cpl)->value + sVar8 * 8 + 8) = local_68;
        (local_68->value).type.depth = (short)sVar8;
        (((ctx->value).type.setters)->value).type.id = (sexp)(((ulong)psVar1 | 1) + 2);
        psVar2 = local_68;
      }
    }
    else {
      psVar2 = sexp_type_exception(ctx,self,9,name);
    }
  }
  else {
    local_48.var = &local_68;
    psVar2 = sexp_user_exception(ctx,self,"register-type: exceeded maximum type limit",name);
  }
LAB_0010e5ef:
  local_60 = psVar2;
  (ctx->value).context.saves = local_58.next;
  return local_60;
}

Assistant:

sexp sexp_register_type_op (sexp ctx, sexp self, sexp_sint_t n, sexp name,
                            sexp parent, sexp slots,
                            sexp fb, sexp felb, sexp flb, sexp flo, sexp fls,
                            sexp sb, sexp so, sexp sc, sexp w, sexp wb, sexp wo,
                            sexp ws, sexp we, sexp p, const char* fname, sexp_proc2 f) {
  sexp *v1, *v2;
  sexp_gc_var2(res, type);
  sexp_uint_t i, len, num_types=sexp_context_num_types(ctx),
    type_array_size=sexp_context_type_array_size(ctx);
  sexp_gc_preserve2(ctx, res, type);
  if (num_types >= SEXP_MAXIMUM_TYPES) {
    res = sexp_user_exception(ctx, self, "register-type: exceeded maximum type limit", name);
  } else if (! sexp_stringp(name)) {
    res = sexp_type_exception(ctx, self, SEXP_STRING, name);
  } else {
    if (num_types >= type_array_size) {
      len = type_array_size*2;
      if (len > SEXP_MAXIMUM_TYPES) len = SEXP_MAXIMUM_TYPES;
      res = sexp_make_vector(ctx, sexp_make_fixnum(len), SEXP_VOID);
      if (sexp_exceptionp(res)) {
        sexp_gc_release2(ctx);
        return res;
      }
      v1 = sexp_vector_data(res);
      v2 = sexp_vector_data(sexp_global(ctx, SEXP_G_TYPES));
      for (i=0; i<num_types; i++)
        v1[i] = v2[i];
      sexp_global(ctx, SEXP_G_TYPES) = res;
    }
    sexp_type_by_index(ctx, num_types) = sexp_alloc_type(ctx, type, SEXP_TYPE);
    type = sexp_type_by_index(ctx, num_types);
    if (!sexp_exceptionp(type)) {
      sexp_pointer_tag(type) = SEXP_TYPE;
      sexp_type_tag(type) = num_types;
      sexp_type_slots(type) = slots;
      sexp_type_field_base(type) = (short)sexp_unbox_fixnum(fb);
      sexp_type_field_eq_len_base(type) = (short)sexp_unbox_fixnum(felb);
      sexp_type_field_len_base(type) = (short)sexp_unbox_fixnum(flb);
      sexp_type_field_len_off(type) = (short)sexp_unbox_fixnum(flo);
      sexp_type_field_len_scale(type) = (unsigned short)sexp_unbox_fixnum(fls);
      sexp_type_size_base(type) = (short)sexp_unbox_fixnum(sb);
      sexp_type_size_off(type) = (short)sexp_unbox_fixnum(so);
      sexp_type_size_scale(type) = (unsigned short)sexp_unbox_fixnum(sc);
      sexp_type_weak_base(type) = (short)sexp_unbox_fixnum(w);
      sexp_type_weak_len_base(type) = (short)sexp_unbox_fixnum(wb);
      sexp_type_weak_len_off(type) = (short)sexp_unbox_fixnum(wo);
      sexp_type_weak_len_scale(type) = (short)sexp_unbox_fixnum(ws);
      sexp_type_weak_len_extra(type) = (short)sexp_unbox_fixnum(we);
      sexp_type_name(type) = name;
      sexp_type_getters(type) = SEXP_FALSE;
      sexp_type_setters(type) = SEXP_FALSE;
      sexp_type_finalize(type) = f;
      sexp_type_finalize_name(type) = (fname) ? sexp_c_string(ctx, fname, -1) : NULL;
      sexp_type_id(type) = SEXP_FALSE;
#if SEXP_USE_DL
      if (f) sexp_type_dl(type) = sexp_context_dl(ctx);
#endif
      sexp_type_print(type) = p;
      if (parent && sexp_typep(parent)) {
        len = sexp_vectorp(sexp_type_cpl(parent)) ? sexp_vector_length(sexp_type_cpl(parent)) : 1;
        sexp_type_cpl(type) = sexp_make_vector(ctx, sexp_make_fixnum(len+1), SEXP_VOID);
        if (parent && sexp_vectorp(sexp_type_cpl(parent)))
          memcpy(sexp_vector_data(sexp_type_cpl(type)),
                 sexp_vector_data(sexp_type_cpl(parent)),
                 len * sizeof(sexp));
        else
          sexp_vector_data(sexp_type_cpl(type))[len-1] = parent;
      } else {
        len = 0;
        sexp_type_cpl(type) = sexp_make_vector(ctx, SEXP_ONE, SEXP_VOID);
      }
      sexp_vector_data(sexp_type_cpl(type))[len] = type;
      sexp_type_depth(type) = (short)len;
      sexp_global(ctx, SEXP_G_NUM_TYPES) = sexp_make_fixnum(num_types + 1);
    }
    res = type;
  }
  sexp_gc_release2(ctx);
  return res;
}